

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_regions.cpp
# Opt level: O3

void __thiscall
Am_Region_Impl::Union(Am_Region_Impl *this,int the_left,int the_top,uint the_width,uint the_height)

{
  _XRegion **pp_Var1;
  _Elt_pointer pp_Var2;
  _Elt_pointer pp_Var3;
  XRectangle x_rect;
  undefined8 local_30;
  
  pp_Var2 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var2 ==
      (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    local_30 = (_XRegion *)XCreateRegion();
    pp_Var2 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (pp_Var2 ==
        (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<_XRegion*,std::allocator<_XRegion*>>::_M_push_back_aux<_XRegion*>
                ((deque<_XRegion*,std::allocator<_XRegion*>> *)&this->stack,(_XRegion **)&local_30);
      pp_Var2 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
    }
    else {
      *pp_Var2 = local_30;
      pp_Var2 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur + 1;
      (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = pp_Var2;
    }
  }
  local_30 = (_XRegion *)
             CONCAT26((short)the_height,
                      CONCAT24((short)the_width,CONCAT22((short)the_top,(short)the_left)));
  if (pp_Var2 ==
      (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pp_Var1 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1];
    pp_Var3 = pp_Var1 + 0x3f;
    pp_Var2 = pp_Var1 + 0x40;
  }
  else {
    pp_Var3 = pp_Var2 + -1;
  }
  XUnionRectWithRegion(&local_30,*pp_Var3,pp_Var2[-1]);
  return;
}

Assistant:

void
Am_Region_Impl::Union(int the_left, int the_top, unsigned int the_width,
                      unsigned int the_height)
{
  // Create a new region for top if needed
  if (stack.empty()) {
    stack.push(XCreateRegion());
  }
  // Set up a rectangle
  XRectangle x_rect; // was static ???
  x_rect.x = the_left;
  x_rect.y = the_top;
  x_rect.width = the_width;
  x_rect.height = the_height;
  // Does the union
  XUnionRectWithRegion(&x_rect, stack.top(), stack.top());
}